

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

bool IsReachableLoadValue(VmInstruction *user,VmInstruction *load)

{
  VmInstructionType VVar1;
  VariableData *container;
  bool bVar2;
  VmValue **ppVVar3;
  byte bVar4;
  VmValue *pVVar5;
  VmInstruction *storeInst;
  
  if (user->parent == load->parent) {
    if ((load->arguments).count == 0) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    ppVVar3 = (load->arguments).data;
    pVVar5 = *ppVVar3;
    if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
      pVVar5 = (VmValue *)0x0;
    }
    storeInst = user->prevSibling;
    bVar4 = 1;
    if (storeInst != load) {
      do {
        VVar1 = storeInst->cmd;
        if (6 < VVar1 - VM_INST_STORE_BYTE) {
          if (1 < VVar1 - VM_INST_SET_RANGE) {
            if (VVar1 != VM_INST_CALL) goto LAB_001b44fd;
            if (((pVVar5 != (VmValue *)0x0) &&
                (container = (VariableData *)pVVar5[1].comment.end, container != (VariableData *)0x0
                )) && (bVar2 = HasAddressTaken(container), !bVar2)) {
              ppVVar3 = (VmValue **)0x1;
              bVar4 = 0;
              goto LAB_001b4539;
            }
          }
LAB_001b4533:
          bVar4 = 0;
          break;
        }
        bVar2 = anon_unknown.dwarf_12e14a::IsLoadAliasedWithStore(load,storeInst);
        if (bVar2) goto LAB_001b4533;
LAB_001b44fd:
        storeInst = storeInst->prevSibling;
        bVar4 = 1;
      } while (storeInst != load);
      ppVVar3 = (VmValue **)0x0;
    }
LAB_001b4539:
    bVar4 = bVar4 | (byte)ppVVar3;
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool IsReachableLoadValue(VmInstruction *user, VmInstruction *load)
{
	if(user->parent != load->parent)
		return false;

	VmValue *loadAddress = load->arguments[0];

	VmConstant *loadAddressConstant = getType<VmConstant>(loadAddress);

	for(VmInstruction *curr = user->prevSibling; curr != load; curr = curr->prevSibling)
	{
		switch(curr->cmd)
		{
		case VM_INST_STORE_BYTE:
		case VM_INST_STORE_SHORT:
		case VM_INST_STORE_INT:
		case VM_INST_STORE_FLOAT:
		case VM_INST_STORE_DOUBLE:
		case VM_INST_STORE_LONG:
		case VM_INST_STORE_STRUCT:
			if(IsLoadAliasedWithStore(load, curr))
				return false;
			break;
		case VM_INST_SET_RANGE:
		case VM_INST_MEM_COPY:
			return false;
		case VM_INST_CALL:
			if(loadAddressConstant && loadAddressConstant->container && !HasAddressTaken(loadAddressConstant->container))
				return true;

			return false;
		default:
			break;
		}
	}

	return true;
}